

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_ReadWeightMap(char *pFileName,Abc_Nam_t *pNames)

{
  int iVar1;
  int Entry;
  Vec_Int_t *p;
  char *__s;
  char *pStr;
  char *__nptr;
  
  iVar1 = Abc_NamObjNumMax(pNames);
  p = Vec_IntStartFull(iVar1);
  __s = Extra_FileReadContents(pFileName);
  if (__s == (char *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    pStr = strtok(__s,"  \n\r(),");
    __nptr = strtok((char *)0x0,"  \n\r(),");
    while (pStr != (char *)0x0) {
      iVar1 = Abc_NamStrFind(pNames,pStr);
      if (iVar1 < 1) {
        printf("Cannot find name \"%s\" among node names of this network.\n",pStr);
      }
      else {
        Entry = atoi(__nptr);
        Vec_IntWriteEntry(p,iVar1,Entry);
        pStr = strtok((char *)0x0,"  \n\r(),;");
        __nptr = strtok((char *)0x0,"  \n\r(),;");
      }
    }
    free(__s);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_ReadWeightMap( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vWeights = Vec_IntStartFull( Abc_NamObjNumMax(pNames) );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pNum;
    if ( pBuffer == NULL )
        return NULL;
    pToken = strtok( pBuffer, "  \n\r()," );
    pNum   = strtok( NULL, "  \n\r()," );
    while ( pToken )
    {
        int NameId = Abc_NamStrFind(pNames, pToken);
        int Number = atoi(pNum);
        if ( NameId <= 0 )
        {
            printf( "Cannot find name \"%s\" among node names of this network.\n", pToken );
            continue;
        }
        Vec_IntWriteEntry( vWeights, NameId, Number );
        pToken = strtok( NULL, "  \n\r(),;" );
        pNum = strtok( NULL, "  \n\r(),;" );
    }
    ABC_FREE( pBuffer );
    return vWeights;
}